

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c++
# Opt level: O0

void __thiscall
kj::MainBuilder::MainImpl::wrapText
          (MainImpl *this,Vector<char> *output,StringPtr indent,StringPtr text)

{
  ArrayPtr<const_char> AVar1;
  char cVar2;
  size_t sVar3;
  NullableValue<unsigned_long> *other;
  unsigned_long *puVar4;
  ArrayPtr<const_char> AVar5;
  StringPtr SVar6;
  MainImpl *local_c8;
  char *local_c0;
  char local_b1;
  ArrayPtr<const_char> local_b0;
  uint local_9c;
  char local_95;
  uint wrapPos;
  ArrayPtr<const_char> local_90;
  ArrayPtr<const_char> local_80 [2];
  StringPtr local_60;
  undefined1 local_50 [8];
  NullableValue<unsigned_long> lineEnd;
  uint width;
  Vector<char> *output_local;
  MainImpl *this_local;
  StringPtr text_local;
  StringPtr indent_local;
  
  text_local.content.ptr = (char *)text.content.size_;
  this_local = (MainImpl *)text.content.ptr;
  text_local.content.size_ = (size_t)indent.content.ptr;
  sVar3 = StringPtr::size((StringPtr *)&text_local.content.size_);
  lineEnd.field_1.value._4_4_ = 0x50 - (int)sVar3;
  do {
    sVar3 = StringPtr::size((StringPtr *)&this_local);
    if (sVar3 == 0) {
      return;
    }
    Vector<char>::addAll<kj::StringPtr&>(output,(StringPtr *)&text_local.content.size_);
    StringPtr::findFirst(&local_60,(char)&this_local);
    other = _::readMaybe<unsigned_long>((Maybe<unsigned_long> *)&local_60);
    _::NullableValue<unsigned_long>::NullableValue((NullableValue<unsigned_long> *)local_50,other);
    Maybe<unsigned_long>::~Maybe((Maybe<unsigned_long> *)&local_60);
    puVar4 = _::NullableValue::operator_cast_to_unsigned_long_((NullableValue *)local_50);
    AVar5 = local_90;
    if (puVar4 == (unsigned_long *)0x0) {
LAB_00307403:
      AVar1.size_ = (size_t)text_local.content.ptr;
      AVar1.ptr = (char *)this_local;
      wrapPos = 0;
    }
    else {
      puVar4 = _::NullableValue<unsigned_long>::operator*((NullableValue<unsigned_long> *)local_50);
      AVar5 = local_90;
      if ((ulong)(uint)lineEnd.field_1.value._4_4_ < *puVar4) goto LAB_00307403;
      puVar4 = _::NullableValue<unsigned_long>::operator*((NullableValue<unsigned_long> *)local_50);
      AVar5 = StringPtr::slice((StringPtr *)&this_local,0,*puVar4 + 1);
      local_80[0] = AVar5;
      Vector<char>::addAll<kj::ArrayPtr<char_const>>(output,local_80);
      puVar4 = _::NullableValue<unsigned_long>::operator*((NullableValue<unsigned_long> *)local_50);
      AVar5 = (ArrayPtr<const_char>)StringPtr::slice((StringPtr *)&this_local,*puVar4 + 1);
      wrapPos = 2;
      AVar1 = AVar5;
    }
    text_local.content.ptr = (char *)AVar1.size_;
    this_local = (MainImpl *)AVar1.ptr;
    local_90 = AVar5;
    _::NullableValue<unsigned_long>::~NullableValue((NullableValue<unsigned_long> *)local_50);
    if (wrapPos == 0) {
      sVar3 = StringPtr::size((StringPtr *)&this_local);
      if (sVar3 <= (uint)lineEnd.field_1.value._4_4_) {
        Vector<char>::addAll<kj::StringPtr&>(output,(StringPtr *)&this_local);
        local_95 = '\n';
        Vector<char>::add<char>(output,&local_95);
        return;
      }
      for (local_9c = lineEnd.field_1.value._4_4_; local_9c != 0; local_9c = local_9c - 1) {
        cVar2 = StringPtr::operator[]((StringPtr *)&this_local,(ulong)local_9c);
        if (cVar2 == ' ') {
          cVar2 = StringPtr::operator[]((StringPtr *)&this_local,(ulong)(local_9c - 1));
          if (cVar2 != ' ') goto LAB_003074cc;
        }
      }
      local_9c = lineEnd.field_1.value._4_4_;
LAB_003074cc:
      local_b0 = StringPtr::slice((StringPtr *)&this_local,0,(ulong)local_9c);
      Vector<char>::addAll<kj::ArrayPtr<char_const>>(output,&local_b0);
      local_b1 = '\n';
      Vector<char>::add<char>(output,&local_b1);
      while( true ) {
        cVar2 = StringPtr::operator[]((StringPtr *)&this_local,(ulong)local_9c);
        if (cVar2 != ' ') break;
        local_9c = local_9c + 1;
      }
      cVar2 = StringPtr::operator[]((StringPtr *)&this_local,(ulong)local_9c);
      if (cVar2 == '\n') {
        local_9c = local_9c + 1;
      }
      SVar6 = StringPtr::slice((StringPtr *)&this_local,(ulong)local_9c);
      local_c8 = (MainImpl *)SVar6.content.ptr;
      this_local = local_c8;
      local_c0 = (char *)SVar6.content.size_;
      text_local.content.ptr = local_c0;
    }
  } while( true );
}

Assistant:

void MainBuilder::MainImpl::wrapText(Vector<char>& output, StringPtr indent, StringPtr text) {
  uint width = 80 - indent.size();

  while (text.size() > 0) {
    output.addAll(indent);

    KJ_IF_MAYBE(lineEnd, text.findFirst('\n')) {
      if (*lineEnd <= width) {
        output.addAll(text.slice(0, *lineEnd + 1));
        text = text.slice(*lineEnd + 1);
        continue;
      }
    }

    if (text.size() <= width) {
      output.addAll(text);
      output.add('\n');
      break;
    }

    uint wrapPos = width;
    for (;; wrapPos--) {
      if (wrapPos == 0) {
        // Hmm, no good place to break words.  Just break in the middle.
        wrapPos = width;
        break;
      } else if (text[wrapPos] == ' ' && text[wrapPos - 1] != ' ') {
        // This position is a space and is preceded by a non-space.  Wrap here.
        break;
      }
    }

    output.addAll(text.slice(0, wrapPos));
    output.add('\n');

    // Skip spaces after the text that was printed.
    while (text[wrapPos] == ' ') {
      ++wrapPos;
    }
    if (text[wrapPos] == '\n') {
      // Huh, apparently there were a whole bunch of spaces at the end of the line followed by a
      // newline.  Skip the newline as well so we don't print a blank line.
      ++wrapPos;
    }
    text = text.slice(wrapPos);
  }
}